

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

float indk::Position::getDistance(Position *L,Position *R)

{
  uint uVar1;
  uint uVar2;
  Error *this;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  uint local_2c;
  float local_28;
  uint i;
  float D;
  Position *R_local;
  Position *L_local;
  
  uVar1 = getDimensionsCount(L);
  uVar2 = getDimensionsCount(R);
  if (uVar1 != uVar2) {
    this = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this,10);
    __cxa_throw(this,&Error::typeinfo,Error::~Error);
  }
  local_28 = 0.0;
  local_2c = 0;
  while( true ) {
    uVar1 = getDimensionsCount(L);
    if (uVar1 <= local_2c) break;
    fVar3 = getPositionValue(L,local_2c);
    fVar4 = getPositionValue(R,local_2c);
    fVar5 = getPositionValue(L,local_2c);
    fVar6 = getPositionValue(R,local_2c);
    local_28 = (fVar3 - fVar4) * (fVar5 - fVar6) + local_28;
    local_2c = local_2c + 1;
  }
  dVar7 = std::sqrt((double)(ulong)(uint)local_28);
  return SUB84(dVar7,0);
}

Assistant:

float indk::Position::getDistance(const indk::Position *L, const indk::Position *R) {
    if (L->getDimensionsCount() != R->getDimensionsCount()) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
    }
    float D = 0;
    for (unsigned int i = 0; i < L->getDimensionsCount(); i++) {
        D += (L->getPositionValue(i)-R->getPositionValue(i))*(L->getPositionValue(i)-R->getPositionValue(i));
    }
    return std::sqrt(D);
}